

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

void N_VAbs_ManyVector(N_Vector x,N_Vector z)

{
  long *in_RSI;
  long *in_RDI;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < *(long *)*in_RDI; local_20 = local_20 + 1) {
    N_VAbs(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_20 * 8),
           *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_20 * 8));
  }
  return;
}

Assistant:

void MVAPPEND(N_VAbs)(N_Vector x, N_Vector z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    N_VAbs(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
    SUNCheckLastErrVoid();
  }
  return;
}